

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformBlockTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::BlockSingleNestedStructCase::init
          (BlockSingleNestedStructCase *this,EVP_PKEY_CTX *ctx)

{
  StructType *pSVar1;
  UniformBlock *pUVar2;
  BlockSingleNestedStructCase *extraout_RAX;
  VarType local_228;
  Uniform local_210;
  VarType local_1d0;
  Uniform local_1b8;
  VarType local_178;
  Uniform local_160;
  VarType local_120;
  Uniform local_108;
  UniformBlock *local_c8;
  UniformBlock *block;
  VarType local_a8;
  StructType *local_90;
  StructType *typeT;
  VarType local_70;
  VarType local_58;
  VarType local_30;
  StructType *local_18;
  StructType *typeS;
  BlockSingleNestedStructCase *this_local;
  
  typeS = (StructType *)this;
  pSVar1 = deqp::gls::ub::ShaderInterface::allocStruct
                     (&(this->super_UniformBlockCase).m_interface,"S");
  local_18 = pSVar1;
  deqp::gls::ub::VarType::VarType(&local_30,TYPE_INT_VEC3,4);
  deqp::gls::ub::StructType::addMember(pSVar1,"a",&local_30,0);
  deqp::gls::ub::VarType::~VarType(&local_30);
  pSVar1 = local_18;
  deqp::gls::ub::VarType::VarType(&local_70,TYPE_FLOAT_MAT3,2);
  deqp::gls::ub::VarType::VarType(&local_58,&local_70,4);
  deqp::gls::ub::StructType::addMember(pSVar1,"b",&local_58,0);
  deqp::gls::ub::VarType::~VarType(&local_58);
  deqp::gls::ub::VarType::~VarType(&local_70);
  pSVar1 = local_18;
  deqp::gls::ub::VarType::VarType((VarType *)&typeT,TYPE_FLOAT_VEC4,4);
  deqp::gls::ub::StructType::addMember(pSVar1,"c",(VarType *)&typeT,0xc00);
  deqp::gls::ub::VarType::~VarType((VarType *)&typeT);
  pSVar1 = deqp::gls::ub::ShaderInterface::allocStruct
                     (&(this->super_UniformBlockCase).m_interface,"T");
  local_90 = pSVar1;
  deqp::gls::ub::VarType::VarType(&local_a8,TYPE_FLOAT_MAT3,2);
  deqp::gls::ub::StructType::addMember(pSVar1,"a",&local_a8,0);
  deqp::gls::ub::VarType::~VarType(&local_a8);
  pSVar1 = local_90;
  deqp::gls::ub::VarType::VarType((VarType *)&block,local_18);
  deqp::gls::ub::StructType::addMember(pSVar1,"b",(VarType *)&block,0);
  deqp::gls::ub::VarType::~VarType((VarType *)&block);
  pUVar2 = deqp::gls::ub::ShaderInterface::allocBlock
                     (&(this->super_UniformBlockCase).m_interface,"Block");
  local_c8 = pUVar2;
  deqp::gls::ub::VarType::VarType(&local_120,local_18);
  deqp::gls::ub::Uniform::Uniform(&local_108,"s",&local_120,0);
  deqp::gls::ub::UniformBlock::addUniform(pUVar2,&local_108);
  deqp::gls::ub::Uniform::~Uniform(&local_108);
  deqp::gls::ub::VarType::~VarType(&local_120);
  pUVar2 = local_c8;
  deqp::gls::ub::VarType::VarType(&local_178,TYPE_FLOAT_VEC2,1);
  deqp::gls::ub::Uniform::Uniform(&local_160,"v",&local_178,0xc00);
  deqp::gls::ub::UniformBlock::addUniform(pUVar2,&local_160);
  deqp::gls::ub::Uniform::~Uniform(&local_160);
  deqp::gls::ub::VarType::~VarType(&local_178);
  pUVar2 = local_c8;
  deqp::gls::ub::VarType::VarType(&local_1d0,local_90);
  deqp::gls::ub::Uniform::Uniform(&local_1b8,"t",&local_1d0,0);
  deqp::gls::ub::UniformBlock::addUniform(pUVar2,&local_1b8);
  deqp::gls::ub::Uniform::~Uniform(&local_1b8);
  deqp::gls::ub::VarType::~VarType(&local_1d0);
  pUVar2 = local_c8;
  deqp::gls::ub::VarType::VarType(&local_228,TYPE_UINT,4);
  deqp::gls::ub::Uniform::Uniform(&local_210,"u",&local_228,0);
  deqp::gls::ub::UniformBlock::addUniform(pUVar2,&local_210);
  deqp::gls::ub::Uniform::~Uniform(&local_210);
  deqp::gls::ub::VarType::~VarType(&local_228);
  deqp::gls::ub::UniformBlock::setFlags(local_c8,this->m_layoutFlags);
  if (0 < this->m_numInstances) {
    deqp::gls::ub::UniformBlock::setInstanceName(local_c8,"block");
    deqp::gls::ub::UniformBlock::setArraySize(local_c8,this->m_numInstances);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void init (void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, PRECISION_HIGH));
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH), UNUSED_BOTH);

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM));
		typeT.addMember("b", VarType(&typeS));

		UniformBlock& block = m_interface.allocBlock("Block");
		block.addUniform(Uniform("s", VarType(&typeS), 0));
		block.addUniform(Uniform("v", VarType(glu::TYPE_FLOAT_VEC2, PRECISION_LOW), UNUSED_BOTH));
		block.addUniform(Uniform("t", VarType(&typeT), 0));
		block.addUniform(Uniform("u", VarType(glu::TYPE_UINT, PRECISION_HIGH), 0));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}
	}